

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_alignment.c
# Opt level: O1

void fsnav_ins_alignment_static(void)

{
  fsnav_imu *pfVar1;
  double dVar2;
  double dVar3;
  double *pdVar4;
  char *__nptr;
  long lVar5;
  double dVar6;
  char t0_token [10];
  char local_30 [16];
  
  builtin_strncpy(local_30,"alignment",10);
  pfVar1 = fsnav->imu;
  if (pfVar1 != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      fsnav_ins_alignment_static::n = 0;
      fsnav_ins_alignment_static::L = (pfVar1->sol).L;
      __nptr = fsnav_locate_token(local_30,pfVar1->cfg,pfVar1->cfglength,'=');
      if ((__nptr == (char *)0x0) ||
         (fsnav_ins_alignment_static::t0 = atof(__nptr), fsnav_ins_alignment_static::t0 <= 0.0)) {
        fsnav_ins_alignment_static::t0 = 300.0;
      }
    }
    else if ((-1 < fsnav->mode) && (pfVar1->t <= fsnav_ins_alignment_static::t0)) {
      (pfVar1->sol).L_valid = '\0';
      (pfVar1->sol).q_valid = '\0';
      (pfVar1->sol).rpy_valid = '\0';
      if ((pfVar1->w_valid != '\0') && (pfVar1->f_valid != '\0')) {
        dVar2 = (double)(fsnav_ins_alignment_static::n + 1);
        dVar6 = (double)fsnav_ins_alignment_static::n;
        lVar5 = 0;
        fsnav_ins_alignment_static::n = fsnav_ins_alignment_static::n + 1;
        do {
          *(double *)((long)fsnav_ins_alignment_static::w + lVar5) =
               *(double *)((long)fsnav_ins_alignment_static::w + lVar5) * (dVar6 / dVar2) +
               *(double *)((long)pfVar1->w + lVar5) / dVar2;
          *(double *)((long)fsnav_ins_alignment_static::f + lVar5) =
               *(double *)((long)fsnav_ins_alignment_static::f + lVar5) * (dVar6 / dVar2) +
               *(double *)((long)pfVar1->f + lVar5) / dVar2;
          lVar5 = lVar5 + 8;
        } while (lVar5 != 0x18);
        fsnav_linal_cross3x1
                  (fsnav_ins_alignment_static::v,fsnav_ins_alignment_static::w,
                   fsnav_ins_alignment_static::f);
        fsnav_ins_alignment_static::d[0] = fsnav_linal_vnorm(fsnav_ins_alignment_static::v,3);
        fsnav_linal_cross3x1
                  (fsnav_ins_alignment_static::vv,fsnav_ins_alignment_static::f,
                   fsnav_ins_alignment_static::v);
        fsnav_ins_alignment_static::d[1] = fsnav_linal_vnorm(fsnav_ins_alignment_static::vv,3);
        fsnav_ins_alignment_static::d[2] = fsnav_linal_vnorm(fsnav_ins_alignment_static::f,3);
      }
      dVar3 = fsnav_ins_alignment_static::d[2];
      dVar6 = fsnav_ins_alignment_static::d[1];
      dVar2 = fsnav_ins_alignment_static::d[0];
      lVar5 = 0;
      do {
        if (*(double *)((long)fsnav_ins_alignment_static::d + lVar5) <= 0.0) {
          return;
        }
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x18);
      pdVar4 = fsnav_ins_alignment_static::L + 2;
      lVar5 = 0;
      do {
        pdVar4[-2] = *(double *)((long)fsnav_ins_alignment_static::v + lVar5) / dVar2;
        pdVar4[-1] = *(double *)((long)fsnav_ins_alignment_static::vv + lVar5) / dVar6;
        *pdVar4 = *(double *)((long)fsnav_ins_alignment_static::f + lVar5) / dVar3;
        lVar5 = lVar5 + 8;
        pdVar4 = pdVar4 + 3;
      } while (lVar5 != 0x18);
      pfVar1 = fsnav->imu;
      (pfVar1->sol).L_valid = '\x01';
      fsnav_linal_mat2quat((pfVar1->sol).q,(pfVar1->sol).L);
      pfVar1 = fsnav->imu;
      (pfVar1->sol).q_valid = '\x01';
      fsnav_linal_mat2rpy((pfVar1->sol).rpy,(pfVar1->sol).L);
      pfVar1 = fsnav->imu;
      (pfVar1->sol).rpy_valid = '\x01';
      (pfVar1->sol).v[0] = 0.0;
      (pfVar1->sol).v[1] = 0.0;
      (pfVar1->sol).v[2] = 0.0;
      (pfVar1->sol).v_valid = '\x01';
    }
  }
  return;
}

Assistant:

void fsnav_ins_alignment_static(void) {

	const char   t0_token[] = "alignment"; // alignment duration parameter name in configuration
	const double t0_default = 300;         // default alignment duration

	static double 
		w [3]	= {0,0,0},  // average angular rate measured by gyroscopes <w>
		f [3]	= {0,0,0},  // average specific force vector measured by accelerometers <f>
		v [3]	= {0,0,0},  // cross product <w> x <f>
		vv[3]	= {0,0,0},  // double cross product <f> x (<w> x <f>)
		d [3]	= {0,0,0},  // vector magnitudes
		*L	    = NULL,     // pointer to attitude matrix in solution
		t0      = -1;       // alignment duration
	static int n = 0;       // measurement counter

	char   *cfg_ptr;        // pointer to a substring in configuration
	double  n1_n;           // (n - 1)/n
	size_t  i, j;			// common index variables


	// check if imu data has been initialized
	if (fsnav->imu == NULL)
		return;

	if (fsnav->mode == 0) {		// init

		// init values
		n = 0;                // drop the counter on init
		L = fsnav->imu->sol.L; // set pointer to imu solution matrix
		// parse alignment duration from configuration string
		cfg_ptr = fsnav_locate_token(t0_token, fsnav->imu->cfg, fsnav->imu->cfglength, '=');
		if (cfg_ptr != NULL)
			t0 = atof(cfg_ptr);		
		// if not found or invalid, set to default
		if (cfg_ptr == NULL || t0 <= 0)
			t0 = t0_default;

	}
	else if (fsnav->mode < 0) {	// terminate
		// do nothing
	}
	else						// main cycle
	{
		// check if alignment duration exceeded 
		if (fsnav->imu->t > t0)
			return;
		// drop validity flags
		fsnav->imu->sol.L_valid		= 0;
		fsnav->imu->sol.q_valid		= 0;
		fsnav->imu->sol.rpy_valid	= 0;
		// renew averages, cross products and their lengths
		if (fsnav->imu->w_valid && fsnav->imu->f_valid) {
			n++;
			n1_n = (n - 1.0)/n;
			for (i = 0; i < 3; i++) {
				w[i] = w[i]*n1_n + fsnav->imu->w[i]/n;
				f[i] = f[i]*n1_n + fsnav->imu->f[i]/n;
			}

			fsnav_linal_cross3x1(v , w, f);	d[0] = fsnav_linal_vnorm(v , 3);
			fsnav_linal_cross3x1(vv, f, v);	d[1] = fsnav_linal_vnorm(vv, 3);
											d[2] = fsnav_linal_vnorm(f , 3);
		}
		// check for singularity
		for (i = 0; i < 3; i++)
			if (d[i] <= 0) // attitude undefined
				return;
		// renew attitude matrix
		for (i = 0, j = 0; j < 3; i += 3, j++) {
			L[i + 0] = v [j]/d[0];
			L[i + 1] = vv[j]/d[1];
			L[i + 2] = f [j]/d[2];
		}
		fsnav->imu->sol.L_valid   = 1;
		// renew quaternion
		fsnav_linal_mat2quat(fsnav->imu->sol.q  , fsnav->imu->sol.L);
		fsnav->imu->sol.q_valid   = 1;
		// renew angles
		fsnav_linal_mat2rpy (fsnav->imu->sol.rpy, fsnav->imu->sol.L);
		fsnav->imu->sol.rpy_valid = 1;
		// set velocity equal to zero, as it is assumed to do so in static alignment
		for (i = 0; i < 3; i++)
			fsnav->imu->sol.v[i] = 0;
		fsnav->imu->sol.v_valid = 1;

	}

}